

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O1

void __thiscall
glcts::MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest::deinit
          (MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  tcu::TestNode::deinit((TestNode *)this);
  if (this->to_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->to_id);
    this->to_id = 0;
  }
  return;
}

Assistant:

void MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Call base class deinitialization routine */
	glcts::TestCase::deinit();

	/* Release test texture object */
	if (to_id != 0)
	{
		gl.deleteTextures(1, &to_id);

		to_id = 0;
	}
}